

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatOrderH.c
# Opt level: O2

void Msat_OrderVarUnassigned(Msat_Order_t *p,int Var)

{
  Msat_IntVec_t *pMVar1;
  Msat_IntVec_t *p_00;
  abctime aVar2;
  abctime aVar3;
  
  aVar2 = Abc_Clock();
  if ((-1 < Var) && (pMVar1 = p->vIndex, Var < pMVar1->nSize)) {
    if (pMVar1->pArray[(uint)Var] == 0) {
      p_00 = p->vHeap;
      pMVar1->pArray[(uint)Var] = p_00->nSize;
      Msat_IntVecPush(p_00,Var);
      Msat_HeapPercolateUp(p,p->vIndex->pArray[(uint)Var]);
    }
    aVar3 = Abc_Clock();
    timeSelect = timeSelect + (aVar3 - aVar2);
    return;
  }
  __assert_fail("HOKAY(p, n)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/msat/msatOrderH.c"
                ,0x14b,"void Msat_HeapInsert(Msat_Order_t *, int)");
}

Assistant:

void Msat_OrderVarUnassigned( Msat_Order_t * p, int Var )
{
//    if (!heap.inHeap(x))
//        heap.insert(x);

    abctime clk = Abc_Clock();
    if ( !HINHEAP(p,Var) )
        Msat_HeapInsert( p, Var );
timeSelect += Abc_Clock() - clk;
}